

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiMesh * __thiscall
Assimp::FBX::FBXConverter::SetupEmptyMesh(FBXConverter *this,Geometry *mesh,aiNode *nd)

{
  bool bVar1;
  aiMesh *paVar2;
  mapped_type *this_00;
  size_type sVar3;
  string *psVar4;
  long lVar5;
  string local_a8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string name;
  aiNode *local_30;
  aiMesh *local_28;
  aiMesh *out_mesh;
  aiNode *nd_local;
  Geometry *mesh_local;
  FBXConverter *this_local;
  
  out_mesh = (aiMesh *)nd;
  nd_local = (aiNode *)mesh;
  mesh_local = (Geometry *)this;
  paVar2 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(paVar2);
  local_28 = paVar2;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&this->meshes,&local_28);
  local_30 = nd_local;
  this_00 = std::
            map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->meshes_converted,(key_type *)&local_30);
  sVar3 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->meshes);
  name.field_2._12_4_ = (int)sVar3 + -1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (this_00,(value_type_conflict1 *)(name.field_2._M_local_buf + 0xc));
  psVar4 = Object::Name_abi_cxx11_((Object *)nd_local);
  std::__cxx11::string::string((string *)local_58,(string *)psVar4);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)local_58);
  bVar1 = std::operator==(&local_78,"Geometry::");
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_a8,(ulong)local_58);
    std::__cxx11::string::operator=((string *)local_58,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  lVar5 = std::__cxx11::string::length();
  if (lVar5 == 0) {
    aiString::operator=(&local_28->mName,(aiString *)out_mesh);
  }
  else {
    aiString::Set(&local_28->mName,(string *)local_58);
  }
  paVar2 = local_28;
  std::__cxx11::string::~string((string *)local_58);
  return paVar2;
}

Assistant:

aiMesh* FBXConverter::SetupEmptyMesh(const Geometry& mesh, aiNode& nd)
        {
            aiMesh* const out_mesh = new aiMesh();
            meshes.push_back(out_mesh);
            meshes_converted[&mesh].push_back(static_cast<unsigned int>(meshes.size() - 1));

            // set name
            std::string name = mesh.Name();
            if (name.substr(0, 10) == "Geometry::") {
                name = name.substr(10);
            }

            if (name.length()) {
                out_mesh->mName.Set(name);
            }
            else
            {
                out_mesh->mName = nd.mName;
            }

            return out_mesh;
        }